

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O3

void testToNonlinear(void)

{
  long lVar1;
  float __x;
  
  lVar1 = 0;
  do {
    if ((~((int)lVar1 + 1U) & 0x7c00) != 0) {
      __x = ABS(*(float *)(_imath_half_to_float_table + 4 + lVar1 * 4));
      if (__x <= 1.0) {
        powf(__x,0.45454544);
      }
      else {
        logf(__x);
      }
    }
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 0xffff);
  puts("test dwaCompressorToNonlinear[]");
  return;
}

Assistant:

void
testToNonlinear ()
{
    unsigned short toNonlinear[65536];

    toNonlinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        unsigned short usNative, usXdr;
        half           h;
        float          sign    = 1;
        float          logBase = pow (2.7182818, 2.2);

        usXdr = i;

        {
            const char* tmp = (char*) (&usXdr);

            Xdr::read<CharPtrIO> (tmp, usNative);
        }

        // map  NaN and inf to 0
        if ((usNative & 0x7c00) == 0x7c00)
        {
            toNonlinear[i] = 0;
            continue;
        }

        //
        // toNonlinear - assume i is XDR
        //
        h.setBits (usNative);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow (fabs ((float) h), 1.f / 2.2f));
        }
        else
        {
            h = (half) (sign * (log (fabs ((float) h)) / log (logBase) + 1.0));
        }
        toNonlinear[i] = h.bits ();
    }

    printf ("test dwaCompressorToNonlinear[]\n");
    for (int i = 0; i < 65536; ++i)
        assert (
            toNonlinear[i] ==
            OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToNonlinear[i]);
}